

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfGenericOutputFile.cpp
# Opt level: O3

void __thiscall
Imf_2_5::GenericOutputFile::writeMagicNumberAndVersionField
          (GenericOutputFile *this,OStream *os,Header *header)

{
  bool bVar1;
  string *name;
  byte bVar2;
  undefined4 local_20;
  undefined1 local_1c;
  byte local_1b;
  undefined2 local_1a;
  
  local_20 = 0x1312f76;
  (*os->_vptr_OStream[2])(os,&local_20,4);
  bVar1 = Header::hasType(header);
  if (bVar1) {
    name = Header::type_abi_cxx11_(header);
    bVar1 = isDeepData(name);
    bVar2 = 8;
    if (bVar1) goto LAB_0015fa8d;
  }
  bVar1 = Header::hasTileDescription(header);
  bVar2 = bVar1 * '\x02';
LAB_0015fa8d:
  bVar1 = usesLongNames(header);
  local_1b = bVar2 | 4;
  if (!bVar1) {
    local_1b = bVar2;
  }
  local_1c = 2;
  local_1a = 0;
  (*os->_vptr_OStream[2])(os,&local_1c,4);
  return;
}

Assistant:

void
GenericOutputFile::writeMagicNumberAndVersionField (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, const Header& header)
{
    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, MAGIC);

    int version = EXR_VERSION;

    if (header.hasType() && isDeepData(header.type()))
    {
        version |= NON_IMAGE_FLAG;
    }
    else
    {
        // (TODO) we may want to check something else in function signature
        // instead of hasTileDescription()?
        if (header.hasTileDescription())
            version |= TILED_FLAG;
    }

    if (usesLongNames (header))
        version |= LONG_NAMES_FLAG;

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, version);
}